

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rmq.cpp
# Opt level: O3

void timing_comp(size_t size)

{
  pointer piVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  long lVar7;
  int *piVar8;
  int iVar9;
  pointer piVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  vector<int,_std::allocator<int>_> els;
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
  rmq;
  vector<int,_std::allocator<int>_> local_d0;
  long local_b8;
  size_t local_b0;
  ulong local_a8;
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
  local_a0;
  
  std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,size,(allocator_type *)&local_a0);
  piVar1 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar10 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
    iVar3 = rand();
    *piVar10 = iVar3 % 1000;
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Generate input: ",0x10);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
  rmq(&local_a0,
      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
      local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,0x100,8);
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Construction RMQ: ",0x12);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_b8 = std::chrono::_V2::system_clock::now();
  if (0 < (int)size) {
    local_a8 = size - 2;
    iVar3 = 0;
    local_b0 = size;
    do {
      sVar2 = local_b0;
      iVar4 = rand();
      uVar12 = (ulong)(long)iVar4 % local_a8;
      iVar4 = rand();
      iVar13 = (int)uVar12;
      uVar14 = (ulong)iVar13;
      iVar4 = (int)((ulong)(long)iVar4 % (~uVar14 + sVar2)) + iVar13;
      uVar12 = (ulong)iVar4;
      _Var6 = rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
              ::query(&local_a0,
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar14),
                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar12));
      piVar11 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + uVar14;
      if (uVar14 != uVar12) {
        piVar8 = local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar14 + 1;
        if (piVar8 != local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar12) {
          iVar9 = *piVar11;
          do {
            if (*piVar8 < iVar9) {
              piVar11 = piVar8;
              iVar9 = *piVar8;
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar12);
        }
      }
      if (*_Var6._M_current != *piVar11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: different mins for range(",0x20);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"rmq at ",7);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*_Var6._M_current);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"mne at ",7);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar11);
        std::endl<char,std::char_traits<char>>(poVar5);
        exit(1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".",1);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      iVar3 = iVar3 + 1;
    } while (iVar3 != (int)local_b0);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RMQ              queries total time: ",0x25);
  poVar5 = std::ostream::_M_insert<double>((double)((lVar7 - local_b8) / 1000000) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_a0.block_mins);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0.superblock_mins);
  std::vector<int,_std::allocator<int>_>::~vector(&local_d0);
  return;
}

Assistant:

void timing_comp(std::size_t size)
{
    auto start_time = std::chrono::high_resolution_clock::now();
    std::vector<int> els(size);
    std::generate(els.begin(), els.end(), [](){return std::rand() % 1000;});

    auto now = std::chrono::high_resolution_clock::now();
    long duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    start_time = now;
    std::cerr << "Generate input: " << duration_ms << std::endl;

    rmq<std::vector<int>::iterator> rmq(els.begin(), els.end());

    now = std::chrono::high_resolution_clock::now();
    duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    std::cerr << "Construction RMQ: " << duration_ms << std::endl;

    int rand_tests = size;
    double rmq_queries = 0.0;
    double minel_queries = 0.0;
    start_time = std::chrono::high_resolution_clock::now();
    for (int i = 0; i < rand_tests; ++i)
    {
        // get random range and start timing
        int range_start = std::rand() % (size - 2);
        int range_end = std::rand() % (size - range_start - 1) + range_start;

        // query RMQ
        auto min = rmq.query(els.begin()+range_start, els.begin()+range_end);

        // stop timing
        //now = std::chrono::high_resolution_clock::now();
        //duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
        //rmq_queries += duration_ms;
        //start_time = now;

        // use linear std::min_element
        auto min2 = std::min_element(els.begin()+range_start, els.begin() + range_end);

        // stop time
        //now = std::chrono::high_resolution_clock::now();
        //duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
        //minel_queries += duration_ms;

        if (*min != *min2)
        {
            std::cerr << "ERROR: different mins for range(" << range_start << "," << range_end << ")" << std::endl;
            std::cerr << "rmq at " << min - els.begin() << " = " << *min << std::endl;
            std::cerr << "mne at " << min2 - els.begin() << " = " << *min2 << std::endl;
            exit(EXIT_FAILURE);
        }
        else
            std::cerr << "." << std::endl;
    }

    now = std::chrono::high_resolution_clock::now();
    duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    std::cout << "RMQ              queries total time: " << duration_ms/1000.0 << "s" << std::endl;
    //std::cout << "std::min_element queries total time: " << minel_queries/1000.0 << "s" << std::endl;
}